

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSvd2x2.h
# Opt level: O0

void Eigen::internal::real_2x2_jacobi_svd<Eigen::Matrix<float,3,3,0,3,3>,float,long>
               (Matrix<float,_3,_3,_0,_3,_3> *matrix,long p,long q,JacobiRotation<float> *j_left,
               JacobiRotation<float> *j_right)

{
  int iVar1;
  Scalar *pSVar2;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar3;
  Scalar *pSVar4;
  float *pfVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *this;
  float extraout_XMM0_Da;
  float fVar7;
  type tVar8;
  double dVar9;
  JacobiRotation<float> JVar10;
  JacobiRotation<float> local_ac [2];
  float local_9c;
  float local_98;
  float tmp;
  float u;
  float d;
  float t;
  JacobiRotation<float> rot1;
  type local_70;
  type local_6c;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> local_68;
  undefined1 local_48 [8];
  Matrix<float,_2,_2,_0,_2,_2> m;
  JacobiRotation<float> *j_right_local;
  JacobiRotation<float> *j_left_local;
  long q_local;
  long p_local;
  Matrix<float,_3,_3,_0,_3,_3> *matrix_local;
  
  Matrix<float,_2,_2,_0,_2,_2>::Matrix((Matrix<float,_2,_2,_0,_2,_2> *)local_48);
  pSVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                     (&matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,p,p);
  local_6c = numext::real<float>(pSVar2);
  DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator<<
            (&local_68,(DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_48,&local_6c);
  pSVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                     (&matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,p,q);
  local_70 = numext::real<float>(pSVar2);
  pCVar3 = CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(&local_68,&local_70);
  pSVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                     (&matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,q,p);
  rot1.m_s = numext::real<float>(pSVar2);
  pCVar3 = CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar3,&rot1.m_s);
  pSVar2 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                     (&matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,q,q);
  rot1.m_c = numext::real<float>(pSVar2);
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar3,&rot1.m_c);
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_68);
  JacobiRotation<float>::JacobiRotation((JacobiRotation<float> *)&d);
  pSVar4 = PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::coeff
                     ((PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_48,0,0);
  fVar7 = *pSVar4;
  pSVar4 = PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::coeff
                     ((PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_48,1,1);
  u = fVar7 + *pSVar4;
  pSVar4 = PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::coeff
                     ((PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_48,1,0);
  fVar7 = *pSVar4;
  this = (PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_48;
  pvVar6 = (void *)0x0;
  pSVar4 = PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::coeff(this,0,1);
  tmp = fVar7 - *pSVar4;
  std::abs((int)this);
  fVar7 = std::numeric_limits<float>::min();
  if (fVar7 <= extraout_XMM0_Da) {
    local_98 = u / tmp;
    tVar8 = numext::abs2<float>(&local_98);
    dVar9 = std::sqrt((double)(ulong)(uint)(tVar8 + 1.0));
    local_9c = SUB84(dVar9,0);
    fVar7 = 1.0 / local_9c;
    pfVar5 = JacobiRotation<float>::s((JacobiRotation<float> *)&d);
    *pfVar5 = fVar7;
    fVar7 = local_98 / local_9c;
    iVar1 = JacobiRotation<float>::c((JacobiRotation<float> *)&d,pvVar6,extraout_RDX_00);
    *(float *)CONCAT44(extraout_var_00,iVar1) = fVar7;
  }
  else {
    pfVar5 = JacobiRotation<float>::s((JacobiRotation<float> *)&d);
    *pfVar5 = 0.0;
    iVar1 = JacobiRotation<float>::c((JacobiRotation<float> *)&d,pvVar6,extraout_RDX);
    *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0x3f800000;
  }
  MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::applyOnTheLeft<float>
            ((MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_48,0,1,
             (JacobiRotation<float> *)&d);
  JacobiRotation<float>::makeJacobi<Eigen::Matrix<float,2,2,0,2,2>>
            (j_right,(MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_48,0,1);
  local_ac[0] = JacobiRotation<float>::transpose(j_right);
  JVar10 = JacobiRotation<float>::operator*((JacobiRotation<float> *)&d,local_ac);
  *j_left = JVar10;
  return;
}

Assistant:

void real_2x2_jacobi_svd(const MatrixType& matrix, Index p, Index q,
                         JacobiRotation<RealScalar> *j_left,
                         JacobiRotation<RealScalar> *j_right)
{
  using std::sqrt;
  using std::abs;
  Matrix<RealScalar,2,2> m;
  m << numext::real(matrix.coeff(p,p)), numext::real(matrix.coeff(p,q)),
       numext::real(matrix.coeff(q,p)), numext::real(matrix.coeff(q,q));
  JacobiRotation<RealScalar> rot1;
  RealScalar t = m.coeff(0,0) + m.coeff(1,1);
  RealScalar d = m.coeff(1,0) - m.coeff(0,1);

  if(abs(d) < (std::numeric_limits<RealScalar>::min)())
  {
    rot1.s() = RealScalar(0);
    rot1.c() = RealScalar(1);
  }
  else
  {
    // If d!=0, then t/d cannot overflow because the magnitude of the
    // entries forming d are not too small compared to the ones forming t.
    RealScalar u = t / d;
    RealScalar tmp = sqrt(RealScalar(1) + numext::abs2(u));
    rot1.s() = RealScalar(1) / tmp;
    rot1.c() = u / tmp;
  }
  m.applyOnTheLeft(0,1,rot1);
  j_right->makeJacobi(m,0,1);
  *j_left = rot1 * j_right->transpose();
}